

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O0

_Bool sx_os_del(char *path,sx_file_type type)

{
  code *pcVar1;
  undefined1 uVar2;
  int iVar3;
  sx_file_type type_local;
  char *path_local;
  
  if (type == SX_FILE_TYPE_INVALID) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/os.c",0x148
                      ,"type != SX_FILE_TYPE_INVALID");
    pcVar1 = (code *)swi(3);
    uVar2 = (*pcVar1)();
    return (_Bool)uVar2;
  }
  if (type == SX_FILE_TYPE_REGULAR) {
    iVar3 = unlink(path);
  }
  else {
    iVar3 = rmdir(path);
  }
  return iVar3 == 0;
}

Assistant:

bool sx_os_del(const char* path, sx_file_type type)
{
    sx_assert(type != SX_FILE_TYPE_INVALID);
#if SX_PLATFORM_WINDOWS
    if (type == SX_FILE_TYPE_REGULAR)
        return DeleteFileA(path) ? true : false;
    else
        return RemoveDirectoryA(path) ? true : false;
#else
    return type == SX_FILE_TYPE_REGULAR ? (unlink(path) == 0) : (rmdir(path) == 0);
#endif
}